

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countmon.cpp
# Opt level: O1

void __thiscall
countmon::update_stats(countmon *this,vector<int,_std::allocator<int>_> *pids,string *read_path)

{
  int iVar1;
  char *__nptr;
  pointer pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  int *piVar8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  undefined8 uVar11;
  int *piVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  string tmp_str;
  ifstream proc_stat;
  stringstream stat_fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  _Rb_tree_node_base *local_458;
  key_type local_450;
  countmon *local_430;
  int *local_428;
  string *local_420;
  value_type local_418;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  local_3f8;
  long local_3c0 [4];
  byte abStack_3a0 [488];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3f8._M_impl.super__Rb_tree_header._M_header;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3f8._M_impl._0_8_ = 0;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3f8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_3f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = (this->count_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_458 = &(this->count_stats)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_430 = this;
  local_420 = read_path;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3f8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var6 != local_458) {
    do {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                             *)&local_3f8,(key_type *)(p_Var6 + 1));
      *pmVar5 = 0;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_458);
  }
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_478,0x14);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  piVar12 = (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  local_428 = (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish;
  if (piVar12 != local_428) {
    do {
      paVar13 = &local_450.field_2;
      iVar1 = *piVar12;
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(local_420->_M_dataplus)._M_p,local_420->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/proc/",6);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/stat",5);
      std::ostream::put((char)poVar7);
      std::__cxx11::stringbuf::str();
      std::ifstream::ifstream(local_3c0,(string *)&local_450,_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != paVar13) {
        operator_delete(local_450._M_dataplus._M_p);
      }
      while (((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0 &&
             ((ulong)((long)local_478.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_478.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x280))) {
        std::operator>>((istream *)local_3c0,(string *)&local_418);
        if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_478,&local_418);
        }
      }
      if (0x260 < (ulong)((long)local_478.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_478.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
        local_450._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"nprocs","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                               *)&local_3f8,&local_450);
        *pmVar5 = *pmVar5 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != paVar13) {
          operator_delete(local_450._M_dataplus._M_p);
        }
        __nptr = local_478.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[0x13]._M_dataplus._M_p;
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        lVar9 = strtol(__nptr,(char **)&local_450,10);
        if (local_450._M_dataplus._M_p == __nptr) {
          std::__throw_invalid_argument("stol");
LAB_0018d34d:
          uVar11 = std::__throw_out_of_range("stol");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_478);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
          ::~_Rb_tree(&local_3f8);
          _Unwind_Resume(uVar11);
        }
        if (*piVar8 == 0) {
          *piVar8 = iVar1;
        }
        else if (*piVar8 == 0x22) goto LAB_0018d34d;
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"nthreads","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                               *)&local_3f8,&local_450);
        *pmVar5 = *pmVar5 + lVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p);
        }
      }
      pbVar4 = local_478.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_478.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar14 = local_478.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_478.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_478.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pcVar2 = (pbVar14->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 != &pbVar14->field_2) {
            operator_delete(pcVar2);
          }
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 != pbVar4);
        local_478.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
      }
      std::ifstream::~ifstream(local_3c0);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      piVar12 = piVar12 + 1;
    } while (piVar12 != local_428);
  }
  p_Var10 = (local_430->count_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var10 != local_458) {
    do {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                             *)&local_3f8,(key_type *)(p_Var10 + 1));
      prmon::monitored_value::set_value((monitored_value *)(p_Var10 + 2),*pmVar5);
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_458);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_478);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
  ::~_Rb_tree(&local_3f8);
  return;
}

Assistant:

void countmon::update_stats(const std::vector<pid_t>& pids,
                            const std::string read_path) {
  prmon::monitored_value_map count_stat_update{};
  for (const auto& stat : count_stats) {
    count_stat_update[stat.first] = 0L;
  }

  std::vector<std::string> stat_entries{};
  stat_entries.reserve(prmon::stat_count_read_limit + 1);
  std::string tmp_str{};
  for (const auto pid : pids) {
    std::stringstream stat_fname{};
    stat_fname << read_path << "/proc/" << pid << "/stat" << std::ends;
    std::ifstream proc_stat{stat_fname.str()};
    while (proc_stat &&
           stat_entries.size() < prmon::stat_count_read_limit + 1) {
      proc_stat >> tmp_str;
      if (proc_stat) stat_entries.push_back(tmp_str);
    }
    if (stat_entries.size() > prmon::stat_count_read_limit) {
      count_stat_update["nprocs"] += 1L;
      count_stat_update["nthreads"] +=
          std::stol(stat_entries[prmon::num_threads]);
    }
    stat_entries.clear();
  }

  // Update the statistics with the new snapshot values
  for (auto& value : count_stats)
    value.second.set_value(count_stat_update[value.first]);
}